

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteBytes
               (int field_number,string *value,CodedOutputStream *output)

{
  LogMessage *other;
  LogFinisher local_59;
  LogMessage local_58;
  
  io::CodedOutputStream::WriteVarint32(output,field_number * 8 + 2);
  if ((value->_M_string_length & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x123);
    other = LogMessage::operator<<(&local_58,"CHECK failed: value.size() <= kint32max: ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  io::CodedOutputStream::WriteVarint32(output,(uint32)value->_M_string_length);
  io::CodedOutputStream::WriteRaw(output,(value->_M_dataplus)._M_p,(int)value->_M_string_length);
  return;
}

Assistant:

void WireFormatLite::WriteBytes(int field_number, const string& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK(value.size() <= kint32max);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}